

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmfont.c
# Opt level: O0

void insert_new_range(BMFONT_PARSER *parser,BMFONT_RANGE *prev,int codepoint)

{
  long lVar1;
  undefined4 *puVar2;
  undefined4 in_EDX;
  long in_RSI;
  undefined8 *in_RDI;
  BMFONT_DATA *data;
  ALLEGRO_FONT *font;
  BMFONT_RANGE *range;
  
  puVar2 = (undefined4 *)
           al_calloc_with_context
                     (1,0x18,0x5d,
                      "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/font/bmfont.c"
                      ,"insert_new_range");
  *puVar2 = in_EDX;
  puVar2[1] = 1;
  reallocate((BMFONT_RANGE *)0x107fea);
  **(undefined8 **)(puVar2 + 2) = in_RDI[3];
  if (in_RSI == 0) {
    lVar1 = *(long *)*in_RDI;
    *(undefined8 *)(puVar2 + 4) = *(undefined8 *)(lVar1 + 0x10);
    *(undefined4 **)(lVar1 + 0x10) = puVar2;
  }
  else {
    *(undefined8 *)(puVar2 + 4) = *(undefined8 *)(in_RSI + 0x10);
    *(undefined4 **)(in_RSI + 0x10) = puVar2;
  }
  return;
}

Assistant:

static void insert_new_range(BMFONT_PARSER *parser, BMFONT_RANGE *prev,
      int codepoint) {
   BMFONT_RANGE *range = al_calloc(1, sizeof *range);
   range->first = codepoint;
   range->count = 1;
   reallocate(range);
   range->characters[0] = parser->c;
   if (prev) {
      range->next = prev->next;
      prev->next = range;
   }
   else {
      ALLEGRO_FONT *font = parser->font;
      BMFONT_DATA *data = font->data;
      range->next = data->range_first;
      data->range_first = range;
   }
}